

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QToolBarAreaLayout::plug(QToolBarAreaLayout *this,QList<int> *path)

{
  QToolBarAreaLayoutItem *pQVar1;
  QDebug *o;
  char *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QToolBarAreaLayoutItem *item;
  char *in_stack_ffffffffffffff98;
  QDebug *in_stack_ffffffffffffffb8;
  QLayoutItem *pQVar2;
  QList<int> *in_stack_ffffffffffffffd0;
  QToolBarAreaLayout *in_stack_ffffffffffffffd8;
  QDebug local_20;
  QDebug in_stack_ffffffffffffffe8;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QToolBarAreaLayout::item(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pQVar1 == (QToolBarAreaLayoutItem *)0x0) {
    QMessageLogger::QMessageLogger(in_RDI,in_RSI,0,in_stack_ffffffffffffff98);
    QMessageLogger::warning();
    o = QDebug::operator<<(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffe8.stream);
    QDebug::QDebug((QDebug *)&stack0xffffffffffffffe8,o);
    ::operator<<(in_stack_ffffffffffffffb8,(QList<int> *)in_RDI);
    QDebug::~QDebug(&local_10);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffe8);
    QDebug::~QDebug(&local_20);
    pQVar2 = (QLayoutItem *)0x0;
  }
  else {
    pQVar1->gap = false;
    pQVar2 = pQVar1->widgetItem;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QToolBarAreaLayout::plug(const QList<int> &path)
{
    QToolBarAreaLayoutItem *item = this->item(path);
    if (Q_UNLIKELY(!item)) {
        qWarning() << "No item at" << path;
        return nullptr;
    }
    Q_ASSERT(item->gap);
    Q_ASSERT(item->widgetItem != nullptr);
    item->gap = false;
    return item->widgetItem;
}